

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merged-constraint.cpp
# Opt level: O3

vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_> *
baryonyx::itm::make_merged_constraints
          (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           *__return_storage_ptr__,context *ctx,problem *pb)

{
  pre_constraint_order *arg1;
  int iVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  pointer pcVar5;
  pointer pcVar6;
  pointer pcVar7;
  pointer pfVar8;
  pointer poVar9;
  __normal_iterator<baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
  __first;
  __normal_iterator<baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
  __last;
  function_element fVar10;
  double dVar11;
  double dVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  pointer pmVar16;
  pointer pmVar17;
  function_element *pfVar18;
  long lVar19;
  double *pdVar20;
  merged_constraint *cst;
  pointer pmVar21;
  pointer poVar22;
  size_t sVar23;
  uint uVar24;
  double *pdVar25;
  pointer ppVar26;
  ulong uVar27;
  function_element *pfVar28;
  tuple<double,_baryonyx::show_size_type> *mem;
  ulong uVar29;
  operator_type op;
  pointer unaff_RBP;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  __i;
  __normal_iterator<baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
  __last_00;
  pointer pfVar30;
  function_element *pfVar31;
  ulong uVar32;
  operator_type oVar33;
  double *pdVar34;
  __normal_iterator<baryonyx::itm::merged_constraint_*,_std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>_>
  __i_2;
  pointer pmVar35;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_> *this;
  long lVar36;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 in_XMM9 [16];
  vector<double,_std::allocator<double>_> variable_cost;
  vector<int,_std::allocator<int>_> variable_constraint_degree;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> constraints_ratio_min;
  allocator_type local_e9;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  local_e8;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *local_d0;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  local_c8;
  undefined1 local_a8 [16];
  undefined1 local_98 [24];
  size_t local_80;
  undefined1 auStack_78 [8];
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_70;
  problem *local_58;
  context *local_50;
  long local_48;
  uint local_40 [2];
  double local_38;
  undefined1 auVar37 [32];
  
  arg1 = &(ctx->parameters).pre_order;
  info<baryonyx::solver_parameters::pre_constraint_order>
            (ctx,"  - merge constraint according to the `{}` algorithm\n",arg1);
  pcVar2 = (pb->equal_constraints).
           super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar3 = (pb->less_constraints).
           super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar4 = (pb->greater_constraints).
           super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar5 = (pb->equal_constraints).
           super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar6 = (pb->less_constraints).
           super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar7 = (pb->greater_constraints).
           super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
           super__Vector_impl_data._M_start;
  (__return_storage_ptr__->
  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = ((long)pcVar4 - (long)pcVar7 >> 4) * -0x5555555555555555 +
             ((long)pcVar3 - (long)pcVar6 >> 4) * -0x5555555555555555 +
             ((long)pcVar2 - (long)pcVar5 >> 4) * -0x5555555555555555;
  std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>::
  reserve(__return_storage_ptr__,(long)(int)local_48);
  switch(*arg1) {
  case none:
    make_unsorted_merged_constraints(&local_e8,ctx,pb);
    local_98._0_8_ =
         (__return_storage_ptr__->
         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         )._M_impl.super__Vector_impl_data._M_end_of_storage;
    this = &local_e8;
    break;
  case memory:
    make_unsorted_merged_constraints(&local_e8,ctx,pb);
    pmVar21 = local_e8.
              super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_98._0_8_ =
         (__return_storage_ptr__->
         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         )._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_e8.
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = pmVar21;
    local_a8._0_8_ =
         (__return_storage_ptr__->
         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_a8._8_8_ =
         (__return_storage_ptr__->
         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    )._M_impl.super__Vector_impl_data._M_start =
         local_e8.
         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         local_e8.
         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_e8.
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ::~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               *)local_a8);
    goto LAB_006144c2;
  case less_greater_equal:
  case less_equal_greater:
  case greater_less_equal:
  case greater_equal_less:
  case equal_less_greater:
  case equal_greater_less:
    local_a8._0_8_ = auStack_78;
    local_a8._8_8_ = (pointer)0x1;
    local_98._0_8_ = (_Hash_node_base *)0x0;
    local_98._8_8_ = 0;
    local_98._16_4_ = 1.0;
    local_80 = 0;
    auStack_78 = (undefined1  [8])0x0;
    local_e8.
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ::reserve(&local_e8,
              ((long)(pb->greater_constraints).
                     super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pb->greater_constraints).
                     super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 +
              ((long)(pb->less_constraints).
                     super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pb->less_constraints).
                     super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 +
              ((long)(pb->equal_constraints).
                     super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pb->equal_constraints).
                     super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
    switch(*arg1) {
    case less_greater_equal:
      oVar33 = greater;
      fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                      *)local_a8,less,pb,&local_e8);
      break;
    case less_equal_greater:
      oVar33 = equal;
      fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                      *)local_a8,less,pb,&local_e8);
      goto LAB_006143fc;
    case greater_less_equal:
      oVar33 = less;
      fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                      *)local_a8,greater,pb,&local_e8);
      break;
    case greater_equal_less:
      oVar33 = equal;
      fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                      *)local_a8,greater,pb,&local_e8);
      goto LAB_00614438;
    case equal_less_greater:
      oVar33 = less;
      fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                      *)local_a8,equal,pb,&local_e8);
LAB_006143fc:
      op = greater;
      fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                      *)local_a8,oVar33,pb,&local_e8);
      goto LAB_00614455;
    case equal_greater_less:
      oVar33 = greater;
      fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                      *)local_a8,equal,pb,&local_e8);
LAB_00614438:
      op = less;
      fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                      *)local_a8,oVar33,pb,&local_e8);
      goto LAB_00614455;
    default:
      goto switchD_00613f85_default;
    }
    op = equal;
    fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
              (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                    *)local_a8,oVar33,pb,&local_e8);
LAB_00614455:
    fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
              (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                    *)local_a8,op,pb,&local_e8);
switchD_00613f85_default:
    std::
    _Hashtable<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_baryonyx::itm::merged_constraint_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_baryonyx::itm::merged_constraint_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_a8);
    pmVar21 = local_e8.
              super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_98._0_8_ =
         (__return_storage_ptr__->
         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         )._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_e8.
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = pmVar21;
    local_a8._0_8_ =
         (__return_storage_ptr__->
         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_a8._8_8_ =
         (__return_storage_ptr__->
         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    )._M_impl.super__Vector_impl_data._M_start =
         local_e8.
         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         local_e8.
         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_e8.
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ::~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               *)local_a8);
LAB_006144c2:
    std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ::~vector(&local_e8);
    improve_memory_usage
              ((itm *)(__return_storage_ptr__->
                      super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                      )._M_impl.super__Vector_impl_data._M_start,
               (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                *)(__return_storage_ptr__->
                  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  )._M_impl.super__Vector_impl_data._M_finish);
    goto switchD_00613eed_default;
  case p1:
  case p2:
  case p3:
  case p4:
    local_d0 = __return_storage_ptr__;
    make_unsorted_merged_constraints(&local_c8,ctx,pb);
    local_e8.
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_e8.
                          super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_a8,
               ((long)(pb->vars).values.
                      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pb->vars).values.
                      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,
               (value_type_conflict2 *)&local_e8,(allocator_type *)&local_70);
    for (pmVar21 = local_c8.
                   super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pmVar21 !=
        local_c8.
        super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
        ._M_impl.super__Vector_impl_data._M_finish; pmVar21 = pmVar21 + 1) {
      pfVar8 = (pmVar21->elements).
               super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pfVar30 = (pmVar21->elements).
                     super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                     ._M_impl.super__Vector_impl_data._M_start; pfVar30 != pfVar8;
          pfVar30 = pfVar30 + 1) {
        *(int *)(local_a8._0_8_ + (long)pfVar30->variable_index * 4) =
             *(int *)(local_a8._0_8_ + (long)pfVar30->variable_index * 4) + 1;
      }
    }
    local_70.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_e8,
               ((long)(pb->vars).values.
                      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pb->vars).values.
                      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,
               (value_type_conflict1 *)&local_70,&local_e9);
    poVar9 = (pb->objective).elements.
             super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (poVar22 = (pb->objective).elements.
                   super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                   ._M_impl.super__Vector_impl_data._M_start; poVar22 != poVar9;
        poVar22 = poVar22 + 1) {
      (&((local_e8.
          super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          ._M_impl.super__Vector_impl_data._M_start)->elements).
        super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>.
        _M_impl.super__Vector_impl_data._M_start)[poVar22->variable_index] =
           (pointer)(poVar22->factor /
                    (double)*(int *)(local_a8._0_8_ + (long)poVar22->variable_index * 4));
    }
    local_58 = pb;
    local_50 = ctx;
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
              (&local_70,
               ((long)local_c8.
                      super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_c8.
                      super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333,
               (allocator_type *)&local_e9);
    ppVar26 = local_70.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar24 = (int)((ulong)((long)local_c8.
                                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_c8.
                                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
    if (uVar24 != 0) {
      uVar32 = 0;
      do {
        pfVar8 = local_c8.
                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar32].elements.
                 super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pfVar30 = (&((local_e8.
                      super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                      ._M_impl.super__Vector_impl_data._M_start)->elements).
                    super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                    ._M_impl.super__Vector_impl_data._M_start)[pfVar8->variable_index];
        auVar46 = ZEXT864(pfVar30);
        local_70.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start[uVar32].first = (int)uVar32;
        local_70.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start[uVar32].second = (double)pfVar30;
        uVar29 = (long)local_c8.
                       super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar32].elements.
                       super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar8;
        if ((uVar29 & 0x7fffffff8) != 8) {
          lVar36 = 0;
          do {
            lVar19 = lVar36 + 1;
            lVar36 = lVar36 + 1;
            auVar47._8_8_ = 0;
            auVar47._0_8_ =
                 (&((local_e8.
                     super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                     ._M_impl.super__Vector_impl_data._M_start)->elements).
                   super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                   ._M_impl.super__Vector_impl_data._M_start)[pfVar8[lVar19].variable_index];
            auVar47 = vminsd_avx(auVar47,auVar46._0_16_);
            auVar46 = ZEXT1664(auVar47);
            local_70.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar32].second = auVar47._0_8_;
          } while ((uVar29 >> 3 & 0xffffffff) - 1 != lVar36);
        }
        uVar32 = uVar32 + 1;
      } while (uVar32 != uVar24);
    }
    if (*arg1 == p1) {
      if (local_70.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_70.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        lVar36 = (long)local_70.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_70.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__0>>
                  (local_70.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_70.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(int)LZCOUNT(lVar36 >> 4) * 2 ^ 0x7e);
        if (lVar36 < 0x101) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__0>>
                    (ppVar26,local_70.
                             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
        }
        else {
          unaff_RBP = ppVar26 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__0>>
                    (ppVar26,unaff_RBP);
          if (unaff_RBP !=
              local_70.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            pdVar34 = &ppVar26[0x10].second;
            do {
              dVar11 = unaff_RBP->second;
              dVar12 = unaff_RBP[-1].second;
              iVar1 = unaff_RBP->first;
              ppVar26 = unaff_RBP;
              pdVar20 = pdVar34;
              if (dVar12 < dVar11) {
                do {
                  pdVar25 = pdVar20;
                  ((pair<int,_double> *)(pdVar25 + -1))->first = *(int *)(pdVar25 + -3);
                  *pdVar25 = dVar12;
                  dVar12 = pdVar25[-4];
                  pdVar20 = pdVar25 + -2;
                } while (dVar12 < dVar11);
                ppVar26 = (pointer)(pdVar25 + -3);
              }
              unaff_RBP = unaff_RBP + 1;
              pdVar34 = pdVar34 + 2;
              ppVar26->first = iVar1;
              ppVar26->second = dVar11;
            } while (unaff_RBP !=
                     local_70.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
        }
      }
    }
    else if (local_70.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start !=
             local_70.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish) {
      lVar36 = (long)local_70.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_70.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__1>>
                (local_70.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_70.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(int)LZCOUNT(lVar36 >> 4) * 2 ^ 0x7e);
      if (lVar36 < 0x101) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__1>>
                  (ppVar26,local_70.
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      else {
        unaff_RBP = ppVar26 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__1>>
                  (ppVar26,unaff_RBP);
        if (unaff_RBP !=
            local_70.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pdVar34 = &ppVar26[0x10].second;
          do {
            dVar11 = unaff_RBP->second;
            dVar12 = unaff_RBP[-1].second;
            iVar1 = unaff_RBP->first;
            ppVar26 = unaff_RBP;
            pdVar20 = pdVar34;
            if (dVar11 < dVar12) {
              do {
                pdVar25 = pdVar20;
                ((pair<int,_double> *)(pdVar25 + -1))->first = *(int *)(pdVar25 + -3);
                *pdVar25 = dVar12;
                dVar12 = pdVar25[-4];
                pdVar20 = pdVar25 + -2;
              } while (dVar11 < dVar12);
              ppVar26 = (pointer)(pdVar25 + -3);
            }
            unaff_RBP = unaff_RBP + 1;
            pdVar34 = pdVar34 + 2;
            ppVar26->first = iVar1;
            ppVar26->second = dVar11;
          } while (unaff_RBP !=
                   local_70.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
      }
    }
    pmVar16 = local_c8.
              super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pmVar21 = local_c8.
              super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar36 = (long)local_c8.
                   super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_c8.
                   super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar32 = (lVar36 >> 3) * -0x3333333333333333;
    uVar29 = uVar32 & 0xffffffff;
    if (uVar29 != 0) {
      auVar46 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar40 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar41 = vpbroadcastq_avx512f(ZEXT816(0x28));
      auVar42 = vpbroadcastq_avx512f(ZEXT816(0x10));
      uVar27 = uVar29 + 0xf & 0xfffffffffffffff0;
      auVar43 = vpbroadcastq_avx512f();
      do {
        uVar13 = vpcmpuq_avx512f(auVar46,auVar43,2);
        uVar14 = vpcmpuq_avx512f(auVar40,auVar43,2);
        vpsllq_avx512f(auVar46,4);
        vpsllq_avx512f(auVar40,4);
        auVar44 = vpmullq_avx512dq(auVar40,auVar41);
        auVar40 = vpaddq_avx512f(auVar40,auVar42);
        uVar27 = uVar27 - 0x10;
        auVar37 = vpgatherqd_avx512f(*(undefined8 *)
                                      ((long)local_70.
                                             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start +
                                      (uVar29 - 1)));
        auVar38._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * auVar37._4_4_;
        auVar38._0_4_ = (uint)((byte)uVar13 & 1) * auVar37._0_4_;
        auVar38._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * auVar37._8_4_;
        auVar38._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * auVar37._12_4_;
        auVar38._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * auVar37._16_4_;
        auVar38._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * auVar37._20_4_;
        auVar38._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * auVar37._24_4_;
        auVar38._28_4_ = (uint)(byte)(uVar13 >> 7) * auVar37._28_4_;
        auVar37 = vpgatherqd_avx512f(*(undefined8 *)
                                      ((long)&unaff_RBP->first +
                                      (long)&(local_70.
                                              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->first));
        auVar39._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar37._4_4_;
        auVar39._0_4_ = (uint)((byte)uVar14 & 1) * auVar37._0_4_;
        auVar39._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar37._8_4_;
        auVar39._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar37._12_4_;
        auVar39._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar37._16_4_;
        auVar39._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar37._20_4_;
        auVar39._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar37._24_4_;
        auVar39._28_4_ = (uint)(byte)(uVar14 >> 7) * auVar37._28_4_;
        auVar45 = vpmullq_avx512dq(auVar46,auVar41);
        auVar46 = vpaddq_avx512f(auVar46,auVar42);
        vpscatterqd_avx512f(ZEXT832(local_c8.
                                    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                    ._M_impl.super__Vector_impl_data._M_start) + ZEXT832(0x20) +
                            auVar44._0_32_,uVar14,auVar39);
        vpscatterqd_avx512f(ZEXT832(local_c8.
                                    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                    ._M_impl.super__Vector_impl_data._M_start) + ZEXT832(0x20) +
                            auVar45._0_32_,uVar13,auVar38);
      } while (uVar27 != 0);
    }
    if (local_c8.
        super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_c8.
        super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::itm::merged_constraint*,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__2>>
                (local_c8.
                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_c8.
                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(int)LZCOUNT(uVar32) * 2 ^ 0x7e);
      if (lVar36 < 0x281) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::merged_constraint*,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__2>>
                  (pmVar21,pmVar16);
      }
      else {
        pmVar35 = pmVar21 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::merged_constraint*,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__2>>
                  (pmVar21,pmVar35);
        for (; pmVar35 != pmVar16; pmVar35 = pmVar35 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<baryonyx::itm::merged_constraint*,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>,__gnu_cxx::__ops::_Val_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__2>>
                    (pmVar35);
        }
      }
    }
    uVar24 = (int)((ulong)((long)local_c8.
                                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_c8.
                                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
    if (uVar24 != 0) {
      uVar32 = 0;
      do {
        __first._M_current =
             local_c8.
             super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar32].elements.
             super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
             ._M_impl.super__Vector_impl_data._M_start;
        __last._M_current =
             local_c8.
             super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar32].elements.
             super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__first._M_current != __last._M_current) {
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::function_element*,std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__3>>
                    (__first,__last,
                     (ulong)(uint)((int)LZCOUNT((long)__last._M_current - (long)__first._M_current
                                                >> 3) * 2) ^ 0x7e,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quesnel[P]baryonyx_lib_src_merged_constraint_cpp:278:19)>
                      )&local_e8);
          if ((long)__last._M_current - (long)__first._M_current < 0x81) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::function_element*,std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__3>>
                      (__first,__last,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quesnel[P]baryonyx_lib_src_merged_constraint_cpp:278:19)>
                        )&local_e8);
          }
          else {
            __last_00._M_current = __first._M_current + 0x10;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::function_element*,std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__3>>
                      (__first,__last_00,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quesnel[P]baryonyx_lib_src_merged_constraint_cpp:278:19)>
                        )&local_e8);
            for (; __last_00._M_current != __last._M_current;
                __last_00._M_current = __last_00._M_current + 1) {
              fVar10 = *__last_00._M_current;
              lVar36 = (long)fVar10 >> 0x20;
              pfVar28 = __last_00._M_current;
              pfVar31 = __last_00._M_current;
              if ((double)(&((local_e8.
                              super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                              ._M_impl.super__Vector_impl_data._M_start)->elements).
                            super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                            ._M_impl.super__Vector_impl_data._M_start)
                          [__last_00._M_current[-1].variable_index] <
                  (double)(&((local_e8.
                              super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                              ._M_impl.super__Vector_impl_data._M_start)->elements).
                            super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                            ._M_impl.super__Vector_impl_data._M_start)[lVar36]) {
                do {
                  pfVar28 = pfVar31 + -1;
                  *pfVar31 = pfVar31[-1];
                  pfVar18 = pfVar31 + -2;
                  pfVar31 = pfVar28;
                } while ((double)(&((local_e8.
                                     super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->elements).
                                   super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                   ._M_impl.super__Vector_impl_data._M_start)
                                 [pfVar18->variable_index] <
                         (double)(&((local_e8.
                                     super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->elements).
                                   super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                   ._M_impl.super__Vector_impl_data._M_start)[lVar36]);
              }
              *pfVar28 = fVar10;
            }
          }
        }
        uVar32 = uVar32 + 1;
      } while (uVar32 != uVar24);
    }
    if (local_70.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_70.
                            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.
                            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    ctx = local_50;
    pb = local_58;
    __return_storage_ptr__ = local_d0;
    if (local_e8.
        super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.
                      super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_e8.
                            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.
                            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((pointer)local_a8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_a8._0_8_,local_98._0_8_ - local_a8._0_8_);
    }
    local_98._0_8_ =
         (__return_storage_ptr__->
         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         )._M_impl.super__Vector_impl_data._M_end_of_storage;
    this = &local_c8;
    break;
  default:
    goto switchD_00613eed_default;
  }
  pmVar21 = (this->
            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pmVar16 = (this->
            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->
       super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  pmVar35 = (__return_storage_ptr__->
            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pmVar17 = (__return_storage_ptr__->
            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  )._M_impl.super__Vector_impl_data._M_start = pmVar21;
  (__return_storage_ptr__->
  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  )._M_impl.super__Vector_impl_data._M_finish = pmVar16;
  (this->
  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->
  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->
  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._0_8_ = pmVar35;
  local_a8._8_8_ = pmVar17;
  std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>::
  ~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           *)local_a8);
  std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>::
  ~vector(this);
switchD_00613eed_default:
  local_e8.
  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_e8.
                         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         (int)((ulong)((long)(__return_storage_ptr__->
                                             super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(__return_storage_ptr__->
                                            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                            )._M_impl.super__Vector_impl_data._M_start) >> 3) *
                         0x33333333 + (int)local_48);
  sVar23 = memory_consumed(pb);
  auVar47 = vcvtusi2sd_avx512f(in_XMM9,sVar23);
  local_40[0] = 0;
  dVar11 = auVar47._0_8_ * 0.0009765625;
  dVar12 = dVar11 * 0.0009765625;
  local_38 = dVar12 * 0.0009765625;
  if ((dVar12 * 0.0009765625 <= 0.5) && (local_40[0] = 1, local_38 = dVar12, dVar12 <= 0.5)) {
    bVar15 = 0.5 < dVar11;
    local_40[0] = bVar15 ^ 3;
    local_38 = (double)((ulong)bVar15 * (long)dVar11 + (ulong)!bVar15 * (long)auVar47._0_8_);
  }
  to_string_abi_cxx11_((string *)local_a8,(baryonyx *)local_40,mem);
  info<int,std::__cxx11::string>
            (ctx,"  - merged constraints removed: {}\n  - problem memory used: {}\n",
             (int *)&local_e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
  if ((pointer)local_a8._0_8_ != (pointer)local_98) {
    operator_delete((void *)local_a8._0_8_,(ulong)(local_98._0_8_ + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<merged_constraint>
make_merged_constraints(const context& ctx, const problem& pb)
{
    info(ctx,
         "  - merge constraint according to the `{}` algorithm\n",
         ctx.parameters.pre_order);

    auto original_nb = static_cast<int>(pb.equal_constraints.size() +
                                        pb.less_constraints.size() +
                                        pb.greater_constraints.size());

    std::vector<merged_constraint> ret;
    ret.reserve(original_nb);

    switch (ctx.parameters.pre_order) {
    case solver_parameters::pre_constraint_order::none:
        ret = make_unsorted_merged_constraints(ctx, pb);
        break;
    case solver_parameters::pre_constraint_order::memory:
        ret = make_unsorted_merged_constraints(ctx, pb);
        improve_memory_usage(ret);
        break;
    case solver_parameters::pre_constraint_order::less_greater_equal:
    case solver_parameters::pre_constraint_order::less_equal_greater:
    case solver_parameters::pre_constraint_order::greater_less_equal:
    case solver_parameters::pre_constraint_order::greater_equal_less:
    case solver_parameters::pre_constraint_order::equal_less_greater:
    case solver_parameters::pre_constraint_order::equal_greater_less:
        ret = make_ordered_merged_constraints(ctx, pb);
        improve_memory_usage(ret);
        break;
    case solver_parameters::pre_constraint_order::p1:
    case solver_parameters::pre_constraint_order::p2:
    case solver_parameters::pre_constraint_order::p3:
    case solver_parameters::pre_constraint_order::p4:
        ret = make_special_merged_constraints(ctx, pb);
        break;
    }

    info(ctx,
         "  - merged constraints removed: {}\n"
         "  - problem memory used: {}\n",
         original_nb - static_cast<int>(ret.size()),
         to_string(memory_consumed_size(memory_consumed(pb))));

    return ret;
}